

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::AggregateMessageSet::ByteSizeLong(AggregateMessageSet *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = google::protobuf::internal::ExtensionSet::MessageSetByteSize
                    (&(this->field_0)._impl_._extensions_);
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar3 = google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                      ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
    sVar2 = sVar2 + sVar3;
  }
  if (((int)sVar2 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar2;
  }
  return sVar2;
}

Assistant:

::size_t AggregateMessageSet::ByteSizeLong() const {
  const AggregateMessageSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_set_byte_size_start:proto2_unittest.AggregateMessageSet)
  ::size_t total_size = this_._impl_._extensions_.MessageSetByteSize();
  if (this_._internal_metadata_.have_unknown_fields()) {
    total_size += ::_pbi::ComputeUnknownMessageSetItemsSize(
        this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance));
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}